

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputConverter.cxx
# Opt level: O2

string * __thiscall
cmOutputConverter::Convert
          (string *__return_storage_ptr__,cmOutputConverter *this,string *source,
          RelativeRoot relative,OutputFormat output)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar1;
  cmState *pcVar2;
  string result;
  string local_60;
  string local_40;
  
  std::__cxx11::string::string((string *)&local_60,(string *)source);
  switch(relative) {
  case FULL:
    cmsys::SystemTools::CollapseFullPath(&local_40,&local_60);
    break;
  case HOME:
    pcVar2 = cmState::Snapshot::GetState(&this->StateSnapshot);
    pvVar1 = cmState::GetSourceDirectoryComponents_abi_cxx11_(pcVar2);
    ConvertToRelativePath(&local_40,this,pvVar1,&local_60,false);
    break;
  case START:
    pvVar1 = cmState::Snapshot::GetCurrentSourceDirectoryComponents_abi_cxx11_(&this->StateSnapshot)
    ;
    ConvertToRelativePath(&local_40,this,pvVar1,&local_60,false);
    break;
  case HOME_OUTPUT:
    pcVar2 = cmState::Snapshot::GetState(&this->StateSnapshot);
    pvVar1 = cmState::GetBinaryDirectoryComponents_abi_cxx11_(pcVar2);
    ConvertToRelativePath(&local_40,this,pvVar1,&local_60,false);
    break;
  case START_OUTPUT:
    pvVar1 = cmState::Snapshot::GetCurrentBinaryDirectoryComponents_abi_cxx11_(&this->StateSnapshot)
    ;
    ConvertToRelativePath(&local_40,this,pvVar1,&local_60,false);
    break;
  default:
    goto switchD_002a1014_default;
  }
  std::__cxx11::string::operator=((string *)&local_60,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
switchD_002a1014_default:
  ConvertToOutputFormat(__return_storage_ptr__,this,&local_60,output);
  std::__cxx11::string::~string((string *)&local_60);
  return __return_storage_ptr__;
}

Assistant:

std::string cmOutputConverter::Convert(const std::string& source,
                                       RelativeRoot relative,
                                       OutputFormat output) const
{
  // Convert the path to a relative path.
  std::string result = source;

  switch (relative)
    {
  case HOME:
    result = this->ConvertToRelativePath(
          this->GetState()->GetSourceDirectoryComponents(), result);
    break;
  case START:
    result = this->ConvertToRelativePath(
          this->StateSnapshot.GetCurrentSourceDirectoryComponents(), result);
    break;
  case HOME_OUTPUT:
    result = this->ConvertToRelativePath(
          this->GetState()->GetBinaryDirectoryComponents(), result);
    break;
  case START_OUTPUT:
    result = this->ConvertToRelativePath(
          this->StateSnapshot.GetCurrentBinaryDirectoryComponents(), result);
    break;
  case FULL:
    result = cmSystemTools::CollapseFullPath(result);
    break;
  case NONE:
    break;
    }
  return this->ConvertToOutputFormat(result, output);
}